

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

any * __thiscall type::any::operator=(any *this,double *value)

{
  erasure_impl<double> *this_00;
  double *value_local;
  any *this_local;
  
  if ((this->_value != (erasure *)0x0) && (this->_value != (erasure *)0x0)) {
    (*this->_value->_vptr_erasure[1])();
  }
  this_00 = (erasure_impl<double> *)operator_new(0x10);
  erasure_impl<double>::erasure_impl(this_00,*value);
  this->_value = (erasure *)this_00;
  return this;
}

Assistant:

any& operator=(T const& value) {
        if(_value) {
          delete _value;
        }

        _value = new erasure_impl<typename std::decay<T const&>::type>(value);
        return *this;
      }